

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.h
# Opt level: O3

bool __thiscall cmSearchPath::PathWithPrefix::operator<(PathWithPrefix *this,PathWithPrefix *other)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  byte extraout_var;
  
  iVar2 = std::__cxx11::string::compare((string *)this);
  if (-1 < iVar2) {
    __n = (this->Path)._M_string_length;
    if ((__n == (other->Path)._M_string_length) &&
       ((__n == 0 ||
        (iVar2 = bcmp((this->Path)._M_dataplus._M_p,(other->Path)._M_dataplus._M_p,__n), iVar2 == 0)
        ))) {
      std::__cxx11::string::compare((string *)&this->Prefix);
      bVar1 = (bool)(extraout_var >> 7);
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return true;
}

Assistant:

bool operator<(const PathWithPrefix& other) const
    {
      return this->Path < other.Path ||
        (this->Path == other.Path && this->Prefix < other.Prefix);
    }